

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O1

void __thiscall KDIS::NETWORK::Connection::startup(Connection *this)

{
  int iVar1;
  KException *this_00;
  int *piVar2;
  KCHAR8 *__s;
  Connection *this_01;
  long lVar3;
  allocator<char> local_39;
  KString local_38;
  
  if (this->m_iSocket[1] == 0 && this->m_iSocket[0] == 0) {
    lVar3 = 2;
    do {
      iVar1 = socket(2,2,0x11);
      this->m_iSocket[lVar3 + -2] = iVar1;
      if (iVar1 == -1) {
        this_01 = (Connection *)0x30;
        this_00 = (KException *)__cxa_allocate_exception();
        piVar2 = __errno_location();
        __s = getErrorText(this_01,*piVar2);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
        KException::KException(this_00,&local_38,0xc);
        __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    if (this->m_bSendOnly == false) {
      bindSocket(this);
      return;
    }
  }
  return;
}

Assistant:

void Connection::startup() noexcept(false)
{
    // Create the sockets if they do not already exist.
    if( !m_iSocket[SEND_SOCK] && !m_iSocket[RECEIVE_SOCK] )
    {
        // Windows only //
#if defined( WIN32 ) | defined( _WIN32 ) | defined( WIN64 ) | defined( _WIN64 )
        WSADATA w;
        static KINT32 iWinSockInit = WSAStartup( 0x0202, &w ); // Init with winsock version 2.2
        if( iWinSockInit != NO_ERROR )
        {
            THROW_ERROR;
        }
#endif

        // Create both sockets
        for( KINT8 i = 0; i < 2; ++i )
        {
            m_iSocket[i] = socket( AF_INET, SOCK_DGRAM, IPPROTO_UDP ); // Create a IPv4 UDP socket.

            if( m_iSocket[i] == INVALID_SOCKET )
            {
                THROW_ERROR;
            }
        }

        // Bind socket for incoming data.
        if( !m_bSendOnly )
            bindSocket();
    }
}